

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlotManager.cpp
# Opt level: O2

CK_RV __thiscall
SlotManager::getSlotList
          (SlotManager *this,ObjectStore *objectStore,CK_BBOOL tokenPresent,CK_SLOT_ID_PTR pSlotList
          ,CK_ULONG_PTR pulCount)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  Token *pTVar4;
  _Base_ptr p_Var5;
  CK_SLOT_ID CVar6;
  size_t slotID;
  long lVar7;
  _Self __tmp_1;
  ulong uVar8;
  CK_RV CVar9;
  long lVar10;
  _Self __tmp;
  long lVar11;
  
  if (pulCount == (CK_ULONG_PTR)0x0) {
    CVar9 = 7;
  }
  else {
    p_Var1 = &(this->slots)._M_t._M_impl.super__Rb_tree_header;
    bVar3 = false;
    uVar8 = 0;
    for (p_Var5 = (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      if ((tokenPresent == '\0') ||
         (bVar2 = Slot::isTokenPresent((Slot *)p_Var5[1]._M_parent), bVar2)) {
        uVar8 = uVar8 + 1;
      }
      pTVar4 = Slot::getToken((Slot *)p_Var5[1]._M_parent);
      if (pTVar4 != (Token *)0x0) {
        pTVar4 = Slot::getToken((Slot *)p_Var5[1]._M_parent);
        bVar2 = Token::isInitialized(pTVar4);
        if (!bVar2) {
          bVar3 = true;
        }
      }
    }
    if (pSlotList == (CK_SLOT_ID_PTR)0x0) {
      if (!bVar3) {
        slotID = ObjectStore::getTokenCount(objectStore);
        insertToken(this,objectStore,slotID,(ObjectStoreToken *)0x0);
        uVar8 = uVar8 + 1;
      }
      CVar9 = 0;
    }
    else {
      CVar9 = 0x150;
      if (uVar8 <= *pulCount) {
        lVar10 = 0;
        p_Var5 = (this->slots)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        lVar7 = uVar8 - 1;
        while ((_Rb_tree_header *)p_Var5 != p_Var1) {
          lVar11 = lVar7;
          if ((tokenPresent != '\x01') ||
             (bVar3 = Slot::isTokenPresent((Slot *)p_Var5[1]._M_parent), bVar3)) {
            bVar3 = Slot::isTokenPresent((Slot *)p_Var5[1]._M_parent);
            if (bVar3) {
              pTVar4 = Slot::getToken((Slot *)p_Var5[1]._M_parent);
              bVar3 = Token::isInitialized(pTVar4);
              if (bVar3) goto LAB_0016a26a;
              CVar6 = Slot::getSlotID((Slot *)p_Var5[1]._M_parent);
              lVar11 = lVar7 + -1;
            }
            else {
LAB_0016a26a:
              CVar6 = Slot::getSlotID((Slot *)p_Var5[1]._M_parent);
              lVar7 = lVar10;
              lVar10 = lVar10 + 1;
            }
            pSlotList[lVar7] = CVar6;
          }
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
          lVar7 = lVar11;
        }
        CVar9 = 0;
      }
    }
    *pulCount = uVar8;
  }
  return CVar9;
}

Assistant:

CK_RV SlotManager::getSlotList(ObjectStore* objectStore, CK_BBOOL tokenPresent, CK_SLOT_ID_PTR pSlotList, CK_ULONG_PTR pulCount)
{
	size_t size( 0 );

	if (pulCount == NULL) return CKR_ARGUMENTS_BAD;

	// Calculate the size of the list
	bool uninitialized = false;
	for (SlotMap::iterator i = slots.begin(); i != slots.end(); i++)
	{
		if ((tokenPresent == CK_FALSE) || i->second->isTokenPresent())
		{
			size++;
		}

		if (i->second->getToken() != NULL && i->second->getToken()->isInitialized() == false)
		{
			uninitialized = true;
		}
	}

	// The user wants the size of the list
	if (pSlotList == NULL)
	{
		// Always have an uninitialized token
		if (uninitialized == false)
		{
			insertToken(objectStore, objectStore->getTokenCount(), NULL);
			size++;
		}

		*pulCount = size;

		return CKR_OK;
	}

	// Is the given buffer too small?
	if (*pulCount < size)
	{
		*pulCount = size;

		return CKR_BUFFER_TOO_SMALL;
	}

	size_t startIx( 0 );
	size_t endIx( size-1 );

	for (SlotMap::iterator i = slots.begin(); i != slots.end(); i++)
	{
		if ((tokenPresent == CK_TRUE) && !i->second->isTokenPresent())
		{// only show token if present on slot. But this slot has no token so we continue
			continue;
		}
		// put uninitialized last. After all initialized or slots without tokens.
		if ( i->second->isTokenPresent() && !i->second->getToken()->isInitialized() ) {
			pSlotList[endIx--] =  i->second->getSlotID();
		} else {
			pSlotList[startIx++] = i->second->getSlotID();
		}
	}
	assert(startIx==endIx+1);
	*pulCount = size;

	return CKR_OK;
}